

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O3

FT_Error pfr_cmap_init(PFR_CMap cmap,FT_Pointer pointer)

{
  uint uVar1;
  uint uVar2;
  FT_Face pFVar3;
  PFR_Char pPVar4;
  uint uVar5;
  long lVar6;
  
  pFVar3 = (cmap->cmap).charmap.face;
  uVar1 = *(uint *)&pFVar3[2].generic.data;
  cmap->num_chars = uVar1;
  pPVar4 = (PFR_Char)pFVar3[2].bbox.xMin;
  cmap->chars = pPVar4;
  if (1 < (ulong)uVar1) {
    lVar6 = 0x10;
    uVar5 = pPVar4->char_code;
    do {
      uVar2 = *(uint *)((long)&pPVar4->char_code + lVar6);
      if (uVar2 <= uVar5) {
        return 8;
      }
      lVar6 = lVar6 + 0x10;
      uVar5 = uVar2;
    } while ((ulong)uVar1 << 4 != lVar6);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_cmap_init( PFR_CMap    cmap,
                 FT_Pointer  pointer )
  {
    FT_Error  error = FT_Err_Ok;
    PFR_Face  face  = (PFR_Face)FT_CMAP_FACE( cmap );

    FT_UNUSED( pointer );


    cmap->num_chars = face->phy_font.num_chars;
    cmap->chars     = face->phy_font.chars;

    /* just for safety, check that the character entries are correctly */
    /* sorted in increasing character code order                       */
    {
      FT_UInt  n;


      for ( n = 1; n < cmap->num_chars; n++ )
      {
        if ( cmap->chars[n - 1].char_code >= cmap->chars[n].char_code )
        {
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }
    }

  Exit:
    return error;
  }